

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipMessage
               (CodedInputStream *input,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  uint32 tag_00;
  WireType WVar2;
  CodedInputStream *in_RDI;
  WireType wire_type;
  uint32 tag;
  uint32 v;
  undefined4 in_stack_ffffffffffffffe8;
  CodedInputStream *pCVar3;
  uint32 tag_01;
  undefined4 in_stack_fffffffffffffff8;
  uint32 uVar4;
  
  do {
    if ((in_RDI->buffer_ < in_RDI->buffer_end_) &&
       (tag_00 = (uint32)*in_RDI->buffer_, tag_00 < 0x80)) {
      pCVar3 = in_RDI;
      io::CodedInputStream::Advance(in_RDI,1);
      tag_01 = (uint32)((ulong)pCVar3 >> 0x20);
    }
    else {
      pCVar3 = in_RDI;
      tag_00 = io::CodedInputStream::ReadTagFallback(input,unknown_fields._4_4_);
      tag_01 = (uint32)((ulong)pCVar3 >> 0x20);
    }
    in_RDI->last_tag_ = tag_00;
    if (tag_00 == 0) {
      return true;
    }
    uVar4 = tag_00;
    WVar2 = WireFormatLite::GetTagWireType(tag_00);
    if (WVar2 == WIRETYPE_END_GROUP) {
      return true;
    }
    bVar1 = SkipField((CodedInputStream *)CONCAT44(uVar4,in_stack_fffffffffffffff8),tag_01,
                      (UnknownFieldSet *)CONCAT44(tag_00,in_stack_ffffffffffffffe8));
  } while (bVar1);
  return false;
}

Assistant:

bool WireFormat::SkipMessage(io::CodedInputStream* input,
                             UnknownFieldSet* unknown_fields) {
  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) {
      // End of input.  This is a valid place to end, so return true.
      return true;
    }

    WireFormatLite::WireType wire_type = WireFormatLite::GetTagWireType(tag);

    if (wire_type == WireFormatLite::WIRETYPE_END_GROUP) {
      // Must be the end of the message.
      return true;
    }

    if (!SkipField(input, tag, unknown_fields)) return false;
  }
}